

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void ptrmapPutOvflPtr(MemPage *pPage,MemPage *pSrc,u8 *pCell,int *pRC)

{
  int iVar1;
  u32 key;
  CellInfo info;
  
  if (*pRC != 0) {
    return;
  }
  (*pPage->xParseCell)(pPage,pCell,&info);
  if (info.nLocal < info.nPayload) {
    if ((pSrc->aDataEnd < pCell) || (pCell + info.nLocal <= pSrc->aDataEnd)) {
      key = sqlite3Get4byte(pCell + ((ulong)info.nSize - 4));
      ptrmapPut(pPage->pBt,key,'\x03',pPage->pgno,pRC);
    }
    else {
      iVar1 = sqlite3CorruptError(0xfc39);
      *pRC = iVar1;
    }
  }
  return;
}

Assistant:

static void ptrmapPutOvflPtr(MemPage *pPage, MemPage *pSrc, u8 *pCell,int *pRC){
  CellInfo info;
  if( *pRC ) return;
  assert( pCell!=0 );
  pPage->xParseCell(pPage, pCell, &info);
  if( info.nLocal<info.nPayload ){
    Pgno ovfl;
    if( SQLITE_WITHIN(pSrc->aDataEnd, pCell, pCell+info.nLocal) ){
      testcase( pSrc!=pPage );
      *pRC = SQLITE_CORRUPT_BKPT;
      return;
    }
    ovfl = get4byte(&pCell[info.nSize-4]);
    ptrmapPut(pPage->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, pRC);
  }
}